

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_gen_iso9660_identifier(archive_write *a,isoent *isoent,idr *idr)

{
  void *pvVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte *__dest;
  size_t sVar7;
  undefined1 *puVar8;
  int iVar9;
  int local_8c;
  int local_88;
  int off;
  int xdoff;
  int extlen;
  int nammax;
  int weight;
  int noff;
  int ext_off;
  char *xdot;
  char *dot;
  int dnmax;
  int ffmax;
  int fnmax;
  char allow_vernum;
  char allow_period;
  char allow_multidot;
  char allow_ldots;
  char *char_map;
  int r;
  int l;
  char *p;
  isoent *np;
  iso9660_conflict *iso9660;
  idr *idr_local;
  isoent *isoent_local;
  archive_write *a_local;
  
  if ((isoent->children).cnt == 0) {
    a_local._4_4_ = 0;
  }
  else {
    pvVar1 = a->format_data;
    if ((*(uint *)((long)pvVar1 + 0x10370) >> 0xe & 7) < 4) {
      bVar4 = false;
      bVar5 = false;
      bVar6 = true;
      ffmax._0_1_ = (byte)(*(uint *)((long)pvVar1 + 0x10370) >> 2) & 1;
      if ((*(uint *)((long)pvVar1 + 0x10370) >> 0xe & 7) == 1) {
        dnmax = 8;
        dot._4_4_ = 0xc;
        dot._0_4_ = 8;
      }
      else {
        dnmax = 0x1e;
        dot._4_4_ = 0x1f;
        dot._0_4_ = 0x1f;
      }
    }
    else {
      bVar5 = true;
      bVar4 = true;
      ffmax._0_1_ = 0;
      bVar6 = false;
      if ((*(uint *)((long)pvVar1 + 0x10370) >> 0x17 & 3) == 0) {
        dot._0_4_ = 0xcf;
        dot._4_4_ = 0xcf;
        dnmax = 0xcf;
      }
      else {
        dot._0_4_ = 0xc1;
        dot._4_4_ = 0xc1;
        dnmax = 0xc1;
      }
    }
    a_local._4_4_ =
         idr_start(a,idr,(isoent->children).cnt,dot._4_4_,3,1,&isoent_gen_iso9660_identifier::rb_ops
                  );
    if (-1 < a_local._4_4_) {
      for (p = (char *)(isoent->children).first; p != (char *)0x0; p = *(char **)(p + 0x70)) {
        weight = (int)*(undefined8 *)(*(long *)(p + 0x18) + 0x48);
        __dest = (byte *)malloc((long)(weight + 0x22));
        if (__dest == (byte *)0x0) {
          archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
          return -0x1e;
        }
        memcpy(__dest,*(void **)(*(long *)(p + 0x18) + 0x40),(long)weight);
        __dest[weight] = 0;
        *(byte **)(p + 0xa8) = __dest;
        _noff = (char *)0x0;
        xdot = (char *)0x0;
        _r = __dest;
        if ((!bVar4) && (*__dest == 0x2e)) {
          _r = __dest + 1;
          *__dest = 0x5f;
        }
        for (; *_r != 0; _r = _r + 1) {
          if (((int)(char)*_r & 0x80U) == 0) {
            if (idr->char_map[*_r] == '\0') {
              if (((char)*_r < 'a') || ('z' < (char)*_r)) {
                if (*_r == 0x2e) {
                  _noff = xdot;
                  xdot = (char *)_r;
                  if (bVar5) goto LAB_00b284f4;
                }
                *_r = 0x5f;
              }
              else {
                *_r = *_r - 0x20;
              }
            }
            else if (*_r == 0x2e) {
              _noff = xdot;
              xdot = (char *)_r;
            }
          }
          else {
            *_r = 0x5f;
          }
LAB_00b284f4:
        }
        lVar2 = *(long *)(p + 0xa8);
        extlen = -1;
        if (xdot == (char *)0x0) {
          if ((char)(p[0xe8] << 6) < '\0') {
            xdoff = (int)dot;
          }
          else {
            xdoff = dnmax;
          }
          if (xdoff < weight) {
            *(undefined1 *)(lVar2 + xdoff) = 0;
            extlen = xdoff;
            weight = xdoff;
          }
        }
        else {
          *xdot = '.';
          iVar9 = (int)xdot - (int)lVar2;
          if ((*(uint *)((long)pvVar1 + 0x10370) >> 0xe & 7) == 1) {
            if ((long)xdot - lVar2 < 9) {
              sVar7 = strlen(xdot);
              weight = iVar9;
              if (4 < sVar7) {
                xdot[4] = '\0';
                extlen = 0;
              }
            }
            else {
              *(char *)(lVar2 + 8) = *xdot;
              *(char *)(lVar2 + 9) = xdot[1];
              *(char *)(lVar2 + 10) = xdot[2];
              *(char *)(lVar2 + 0xb) = xdot[3];
              *(undefined1 *)(lVar2 + 0xc) = 0;
              extlen = 8;
              weight = 8;
            }
          }
          else if ((char)(p[0xe8] << 6) < '\0') {
            bVar3 = (int)dot < weight;
            weight = iVar9;
            if (bVar3) {
              *(undefined1 *)(lVar2 + (int)dot) = 0;
              extlen = (int)dot;
              if ((int)dot < iVar9) {
                weight = (int)dot;
              }
            }
          }
          else {
            bVar3 = dot._4_4_ < weight;
            weight = iVar9;
            if (bVar3) {
              sVar7 = strlen(xdot);
              off = (int)sVar7;
              if (_noff == (char *)0x0) {
                local_88 = 0;
              }
              else {
                local_88 = (int)_noff - (int)lVar2;
              }
              if ((off < 2) || (dnmax + -1 <= local_88)) {
                *(undefined1 *)(lVar2 + dnmax) = 0;
                weight = dnmax;
                extlen = weight;
              }
              else {
                if (dot._4_4_ < off) {
                  off = dot._4_4_;
                }
                local_8c = dot._4_4_ - off;
                if (local_8c == 0) {
                  local_8c = 1;
                  off = off + -1;
                }
                memmove((void *)(lVar2 + local_8c),xdot,(long)off);
                *(undefined1 *)(lVar2 + dot._4_4_) = 0;
                weight = local_8c;
                extlen = weight;
              }
            }
          }
        }
        *(int *)(p + 0xb0) = weight;
        sVar7 = strlen((char *)(lVar2 + weight));
        *(int *)(p + 0xb4) = (int)sVar7;
        iVar9 = weight + *(int *)(p + 0xb4);
        *(int *)(p + 0xb8) = iVar9;
        if ((*(uint *)((long)pvVar1 + 0x10370) >> 0xe & 7) == 1) {
          if (weight < 5) {
            nammax = weight;
          }
          else {
            nammax = 5;
          }
        }
        else if (iVar9 == dot._4_4_) {
          nammax = weight + -3;
        }
        else if (iVar9 == dot._4_4_ + -1) {
          nammax = weight + -2;
        }
        else if (iVar9 == dot._4_4_ + -2) {
          nammax = weight + -1;
        }
        else {
          nammax = weight;
        }
        idr_register(idr,(isoent *)p,extlen,nammax);
      }
      idr_resolve(idr,idr_set_num);
      for (p = (char *)(isoent->children).first; p != (char *)0x0; p = *(char **)(p + 0x70)) {
        if (((char)(p[0xe8] << 6) < '\0') || (*(long *)(p + 200) != 0)) {
          *(int *)(p + 0xb8) = *(int *)(p + 0xb0) + *(int *)(p + 0xb4);
        }
        else {
          puVar8 = (undefined1 *)
                   (*(long *)(p + 0xa8) + (long)*(int *)(p + 0xb0) + (long)*(int *)(p + 0xb4));
          _r = puVar8;
          if ((*(int *)(p + 0xb4) == 0) && (bVar6)) {
            _r = puVar8 + 1;
            *puVar8 = 0x2e;
            p[0xb4] = '\x01';
            p[0xb5] = '\0';
            p[0xb6] = '\0';
            p[0xb7] = '\0';
          }
          if ((*(int *)(p + 0xb4) == 1) && (!bVar6)) {
            _r[-1] = 0;
            p[0xb4] = '\0';
            p[0xb5] = '\0';
            p[0xb6] = '\0';
            p[0xb7] = '\0';
            _r = _r + -1;
          }
          *(int *)(p + 0xb8) = *(int *)(p + 0xb0) + *(int *)(p + 0xb4);
          if ((byte)ffmax != 0) {
            puVar8 = _r + 1;
            *_r = 0x3b;
            _r = _r + 2;
            *puVar8 = 0x31;
            *(int *)(p + 0xb8) = *(int *)(p + 0xb8) + 2;
          }
          *_r = 0;
        }
        *(undefined4 *)(p + 0xbc) = *(undefined4 *)(p + 0xb8);
      }
      a_local._4_4_ = 0;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
isoent_gen_iso9660_identifier(struct archive_write *a, struct isoent *isoent,
    struct idr *idr)
{
	struct iso9660 *iso9660;
	struct isoent *np;
	char *p;
	int l, r;
	const char *char_map;
	char allow_ldots, allow_multidot, allow_period, allow_vernum;
	int fnmax, ffmax, dnmax;
	static const struct archive_rb_tree_ops rb_ops = {
		isoent_cmp_node_iso9660, isoent_cmp_key_iso9660
	};

	if (isoent->children.cnt == 0)
		return (0);

	iso9660 = a->format_data;
	char_map = idr->char_map;
	if (iso9660->opt.iso_level <= 3) {
		allow_ldots = 0;
		allow_multidot = 0;
		allow_period = 1;
		allow_vernum = iso9660->opt.allow_vernum;
		if (iso9660->opt.iso_level == 1) {
			fnmax = 8;
			ffmax = 12;/* fnmax + '.' + 3 */
			dnmax = 8;
		} else {
			fnmax = 30;
			ffmax = 31;
			dnmax = 31;
		}
	} else {
		allow_ldots = allow_multidot = 1;
		allow_period = allow_vernum = 0;
		if (iso9660->opt.rr)
			/*
			 * MDR : The maximum size of Directory Record(254).
			 * DRL : A Directory Record Length(33).
			 * CE  : A size of SUSP CE System Use Entry(28).
			 * MDR - DRL - CE = 254 - 33 - 28 = 193.
			 */
			fnmax = ffmax = dnmax = 193;
		else
			/*
			 * XA  : CD-ROM XA System Use Extension
			 *       Information(14).
			 * MDR - DRL - XA = 254 - 33 -14 = 207.
			 */
			fnmax = ffmax = dnmax = 207;
	}

	r = idr_start(a, idr, isoent->children.cnt, ffmax, 3, 1, &rb_ops);
	if (r < 0)
		return (r);

	for (np = isoent->children.first; np != NULL; np = np->chnext) {
		char *dot, *xdot;
		int ext_off, noff, weight;

		l = (int)np->file->basename.length;
		p = malloc(l+31+2+1);
		if (p == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
		memcpy(p, np->file->basename.s, l);
		p[l] = '\0';
		np->identifier = p;

		dot = xdot = NULL;
		if (!allow_ldots) {
			/*
			 * If there is a '.' character at the first byte,
			 * it has to be replaced by '_' character.
			 */
			if (*p == '.')
				*p++ = '_';
		}
		for (;*p; p++) {
			if (*p & 0x80) {
				*p = '_';
				continue;
			}
			if (char_map[(unsigned char)*p]) {
				/* if iso-level is '4', a character '.' is
				 * allowed by char_map. */
				if (*p == '.') {
					xdot = dot;
					dot = p;
				}
				continue;
			}
			if (*p >= 'a' && *p <= 'z') {
				*p -= 'a' - 'A';
				continue;
			}
			if (*p == '.') {
				xdot = dot;
				dot = p;
				if (allow_multidot)
					continue;
			}
			*p = '_';
		}
		p = np->identifier;
		weight = -1;
		if (dot == NULL) {
			int nammax;

			if (np->dir)
				nammax = dnmax;
			else
				nammax = fnmax;

			if (l > nammax) {
				p[nammax] = '\0';
				weight = nammax;
				ext_off = nammax;
			} else
				ext_off = l;
		} else {
			*dot = '.';
			ext_off = (int)(dot - p);

			if (iso9660->opt.iso_level == 1) {
				if (dot - p <= 8) {
					if (strlen(dot) > 4) {
						/* A length of a file extension
						 * must be less than 4 */
						dot[4] = '\0';
						weight = 0;
					}
				} else {
					p[8] = dot[0];
					p[9] = dot[1];
					p[10] = dot[2];
					p[11] = dot[3];
					p[12] = '\0';
					weight = 8;
					ext_off = 8;
				}
			} else if (np->dir) {
				if (l > dnmax) {
					p[dnmax] = '\0';
					weight = dnmax;
					if (ext_off > dnmax)
						ext_off = dnmax;
				}
			} else if (l > ffmax) {
				int extlen = (int)strlen(dot);
				int xdoff;

				if (xdot != NULL)
					xdoff = (int)(xdot - p);
				else
					xdoff = 0;

				if (extlen > 1 && xdoff < fnmax-1) {
					int off;

					if (extlen > ffmax)
						extlen = ffmax;
					off = ffmax - extlen;
					if (off == 0) {
						/* A dot('.')  character
						 * doesn't place to the first
						 * byte of identifier. */
						off ++;
						extlen --;
					}
					memmove(p+off, dot, extlen);
					p[ffmax] = '\0';
					ext_off = off;
					weight = off;
#ifdef COMPAT_MKISOFS
				} else if (xdoff >= fnmax-1) {
					/* Simulate a bug(?) of mkisofs. */
					p[fnmax-1] = '\0';
					ext_off = fnmax-1;
					weight = fnmax-1;
#endif
				} else {
					p[fnmax] = '\0';
					ext_off = fnmax;
					weight = fnmax;
				}
			}
		}
		/* Save an offset of a file name extension to sort files. */
		np->ext_off = ext_off;
		np->ext_len = (int)strlen(&p[ext_off]);
		np->id_len = l = ext_off + np->ext_len;

		/* Make an offset of the number which is used to be set
		 * hexadecimal number to avoid duplicate identifier. */
		if (iso9660->opt.iso_level == 1) {
			if (ext_off >= 5)
				noff = 5;
			else
				noff = ext_off;
		} else {
			if (l == ffmax)
				noff = ext_off - 3;
			else if (l == ffmax-1)
				noff = ext_off - 2;
			else if (l == ffmax-2)
				noff = ext_off - 1;
			else
				noff = ext_off;
		}
		/* Register entry to the identifier resolver. */
		idr_register(idr, np, weight, noff);
	}

	/* Resolve duplicate identifier. */
	idr_resolve(idr, idr_set_num);

	/* Add a period and a version number to identifiers. */
	for (np = isoent->children.first; np != NULL; np = np->chnext) {
		if (!np->dir && np->rr_child == NULL) {
			p = np->identifier + np->ext_off + np->ext_len;
			if (np->ext_len == 0 && allow_period) {
				*p++ = '.';
				np->ext_len = 1;
			}
			if (np->ext_len == 1 && !allow_period) {
				*--p = '\0';
				np->ext_len = 0;
			}
			np->id_len = np->ext_off + np->ext_len;
			if (allow_vernum) {
				*p++ = ';';
				*p++ = '1';
				np->id_len += 2;
			}
			*p = '\0';
		} else
			np->id_len = np->ext_off + np->ext_len;
		np->mb_len = np->id_len;
	}
	return (ARCHIVE_OK);
}